

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

time_t RelativeMonth(time_t Start,time_t Timezone,time_t RelMonth)

{
  time_t Start_00;
  tm *ptVar1;
  long lVar2;
  time_t Future;
  time_t Year;
  time_t Month;
  tm *tm;
  time_t RelMonth_local;
  time_t Timezone_local;
  time_t Start_local;
  
  if (RelMonth == 0) {
    Start_local = 0;
  }
  else {
    Timezone_local = Start;
    ptVar1 = localtime(&Timezone_local);
    Start_00 = Timezone_local;
    lVar2 = ((ptVar1->tm_year + 0x76c) * 0xc + ptVar1->tm_mon) + RelMonth;
    Future = Convert(lVar2 % 0xc + 1,(long)ptVar1->tm_mday,lVar2 / 0xc,(long)ptVar1->tm_hour,
                     (long)ptVar1->tm_min,(long)ptVar1->tm_sec,Timezone,DSTmaybe);
    Start_local = DSTcorrect(Start_00,Future);
  }
  return Start_local;
}

Assistant:

static time_t
RelativeMonth(time_t Start, time_t Timezone, time_t RelMonth)
{
	struct tm	*tm;
	time_t	Month;
	time_t	Year;

	if (RelMonth == 0)
		return 0;
	tm = localtime(&Start);
	Month = 12 * (tm->tm_year + 1900) + tm->tm_mon + RelMonth;
	Year = Month / 12;
	Month = Month % 12 + 1;
	return DSTcorrect(Start,
	    Convert(Month, (time_t)tm->tm_mday, Year,
		(time_t)tm->tm_hour, (time_t)tm->tm_min, (time_t)tm->tm_sec,
		Timezone, DSTmaybe));
}